

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int EmitRows(WEBP_CSP_MODE colorspace,uint8_t *row_in,int in_stride,int mb_w,int mb_h,uint8_t *out,
            int out_stride)

{
  int iVar1;
  int in_R8D;
  undefined8 in_R9;
  uint8_t *row_out;
  int lines;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe0;
  
  iVar2 = in_R8D;
  while (iVar1 = iVar2 + -1, 0 < iVar2) {
    VP8LConvertFromBGRA((uint32_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
                        (int)((ulong)in_R9 >> 0x20),(WEBP_CSP_MODE)in_R9,
                        (uint8_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    iVar2 = iVar1;
  }
  return in_R8D;
}

Assistant:

static int EmitRows(WEBP_CSP_MODE colorspace,
                    const uint8_t* row_in, int in_stride,
                    int mb_w, int mb_h,
                    uint8_t* const out, int out_stride) {
  int lines = mb_h;
  uint8_t* row_out = out;
  while (lines-- > 0) {
    VP8LConvertFromBGRA((const uint32_t*)row_in, mb_w, colorspace, row_out);
    row_in += in_stride;
    row_out += out_stride;
  }
  return mb_h;  // Num rows out == num rows in.
}